

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_hierarchy.hpp
# Opt level: O1

SphereTree *
sphere_hierarchy(SphereTree *__return_storage_ptr__,vector<Sphere,_std::allocator<Sphere>_> *spheres
                )

{
  vector<SphereTree,_std::allocator<SphereTree>_> *this;
  undefined8 *puVar1;
  pointer pSVar2;
  pointer pSVar3;
  pointer pSVar4;
  undefined8 uVar5;
  SphereTree *pSVar6;
  data_t dVar7;
  invalid_argument *this_00;
  SphereTree *p;
  ulong uVar8;
  SphereTree *pSVar9;
  pointer pSVar10;
  pointer pSVar11;
  SphereTree *pSVar12;
  SphereTree *pSVar13;
  long lVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Sphere SVar19;
  vector<SphereTree,_std::allocator<SphereTree>_> nodes;
  vector<SphereTree,_std::allocator<SphereTree>_> parents;
  SphereTree o;
  float local_f0;
  float local_ec;
  vector<SphereTree,_std::allocator<SphereTree>_> local_e8;
  vector<SphereTree,_std::allocator<SphereTree>_> local_c8;
  SphereTree local_a8;
  SphereTree *local_80;
  vec3f local_78;
  float fStack_6c;
  vector<SphereTree,_std::allocator<SphereTree>_> local_68;
  vector<Sphere,_std::allocator<Sphere>_> local_48;
  
  local_80 = __return_storage_ptr__;
  github111116::ConsoleLogger::log<char[29]>(&console,(char (*) [29])"building sphere hierarchy...")
  ;
  local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
  super__Vector_impl_data._M_start = (SphereTree *)0x0;
  local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
  super__Vector_impl_data._M_finish = (SphereTree *)0x0;
  local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar11 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pSVar2 = (spheres->super__Vector_base<Sphere,_std::allocator<Sphere>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pSVar11 != pSVar2) {
    do {
      local_a8.bound.center.x = (pSVar11->center).x;
      local_a8.bound.center.y = (pSVar11->center).y;
      local_a8.bound._8_8_ = *(undefined8 *)&(pSVar11->center).z;
      local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<SphereTree,_std::allocator<SphereTree>_>::emplace_back<SphereTree>
                (&local_e8,&local_a8);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_a8.child);
      pSVar11 = pSVar11 + 1;
    } while (pSVar11 != pSVar2);
  }
  if (1 < (ulong)(((long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333)) {
    this = &local_a8.child;
    do {
      std::
      random_shuffle<__gnu_cxx::__normal_iterator<SphereTree*,std::vector<SphereTree,std::allocator<SphereTree>>>>
                ((__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                  )local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<SphereTree_*,_std::vector<SphereTree,_std::allocator<SphereTree>_>_>
                  )local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_finish);
      local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_start = (SphereTree *)0x0;
      local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_finish = (SphereTree *)0x0;
      local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar8 = 0xffffffffffffffff;
      lVar14 = 8;
      do {
        puVar1 = (undefined8 *)
                 ((long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl
                        .super__Vector_impl_data._M_start + lVar14 + -8);
        local_a8.bound.center._0_8_ = *puVar1;
        local_a8.bound._8_8_ = puVar1[1];
        local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.child.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<SphereTree,_std::allocator<SphereTree>_>::emplace_back<SphereTree>
                  (&local_c8,&local_a8);
        std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_a8.child);
        uVar8 = uVar8 + 1;
        lVar14 = lVar14 + 0x28;
      } while (uVar8 < ((long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333 -
                       1U >> 2);
      local_ec = 1e+18;
      pSVar9 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar13 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                super__Vector_impl_data._M_finish;
      do {
        for (; pSVar3 = local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl
                        .super__Vector_impl_data._M_finish,
            pSVar12 = local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                      super__Vector_impl_data._M_start,
            pSVar6 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                     super__Vector_impl_data._M_finish, pSVar9 != pSVar13; pSVar9 = pSVar9 + 1) {
          pSVar3 = (pSVar9->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pSVar4 = (pSVar9->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pSVar10 = pSVar3;
          if (pSVar4 != pSVar3) {
            do {
              std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&pSVar10->child);
              pSVar10 = pSVar10 + 1;
            } while (pSVar10 != pSVar4);
            (pSVar9->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_finish = pSVar3;
          }
        }
        for (; pSVar12 != pSVar3; pSVar12 = pSVar12 + 1) {
          local_a8.bound.center.x = (pSVar12->bound).center.x;
          local_a8.bound.center.y = (pSVar12->bound).center.y;
          local_a8.bound._8_8_ = *(undefined8 *)&(pSVar12->bound).center.z;
          local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
          super__Vector_impl_data._M_finish = pSVar6;
          std::vector<SphereTree,_std::allocator<SphereTree>_>::vector(this,&pSVar12->child);
          local_78.x = local_a8.bound.center.x;
          local_78.y = local_a8.bound.center.y;
          local_78.z = local_a8.bound.center.z;
          fStack_6c = local_a8.bound.radius;
          std::vector<SphereTree,_std::allocator<SphereTree>_>::vector(&local_68,this);
          pSVar4 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pSVar10 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pSVar13 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                    super__Vector_impl_data._M_start;
          if (local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
              super__Vector_impl_data._M_start ==
              local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
            std::invalid_argument::invalid_argument(this_00,"empty container is not allowed.");
            __cxa_throw(this_00,&std::invalid_argument::typeinfo,
                        std::invalid_argument::~invalid_argument);
          }
          while (pSVar9 = pSVar10, pSVar13 = pSVar13 + 1, pSVar13 != pSVar4) {
            fVar16 = (pSVar13->bound).center.x - local_78.x;
            fVar17 = (pSVar13->bound).center.y - local_78.y;
            fVar15 = (pSVar13->bound).center.z - local_78.z;
            fVar15 = fVar15 * fVar15 + fVar16 * fVar16 + fVar17 * fVar17;
            if (fVar15 < 0.0) {
              fVar15 = sqrtf(fVar15);
            }
            else {
              fVar15 = SQRT(fVar15);
            }
            fVar17 = (pSVar9->bound).center.x - local_78.x;
            fVar18 = (pSVar9->bound).center.y - local_78.y;
            fVar16 = (pSVar9->bound).center.z - local_78.z;
            fVar16 = fVar16 * fVar16 + fVar17 * fVar17 + fVar18 * fVar18;
            if (fVar16 < 0.0) {
              fVar16 = sqrtf(fVar16);
            }
            else {
              fVar16 = SQRT(fVar16);
            }
            pSVar10 = pSVar13;
            if (fVar16 <= fVar15) {
              pSVar10 = pSVar9;
            }
          }
          std::vector<SphereTree,_std::allocator<SphereTree>_>::push_back(&pSVar9->child,&local_a8);
          std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_68);
          std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(this);
          pSVar6 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        pSVar13 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pSVar9 = pSVar6;
        for (pSVar12 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                       super__Vector_impl_data._M_start;
            local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_start = pSVar13,
            local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_finish = pSVar9, pSVar12 != pSVar6; pSVar12 = pSVar12 + 1) {
          sphere_tree_leaves(&local_48,pSVar12);
          SVar19 = sphere_set_bounding_sphere(&local_48);
          (pSVar12->bound).center.x = (data_t)(int)SVar19.center._0_8_;
          (pSVar12->bound).center.y = (data_t)(int)((ulong)SVar19.center._0_8_ >> 0x20);
          (pSVar12->bound).center.z = SVar19.center.z;
          (pSVar12->bound).radius = SVar19.radius;
          if (local_48.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          pSVar13 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pSVar9 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        if (pSVar13 == pSVar9) {
          local_f0 = 0.0;
        }
        else {
          local_f0 = 0.0;
          do {
            local_a8.bound.center.x = (pSVar13->bound).center.x;
            local_a8.bound.center.y = (pSVar13->bound).center.y;
            local_a8.bound._8_8_ = *(undefined8 *)&(pSVar13->bound).center.z;
            std::vector<SphereTree,_std::allocator<SphereTree>_>::vector
                      (&local_a8.child,&pSVar13->child);
            local_f0 = local_f0 + local_a8.bound.radius;
            std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_a8.child);
            pSVar13 = pSVar13 + 1;
          } while (pSVar13 != pSVar9);
        }
        if (local_ec < local_f0) {
          github111116::ConsoleLogger::debug<char[35]>
                    (&console,(char (*) [35])"sphere clustering: loss increasing");
        }
        fVar15 = local_ec + -1e-05;
        pSVar9 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pSVar13 = local_c8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        local_ec = local_f0;
      } while (local_f0 <= fVar15);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::operator=(&local_e8,&local_c8);
      std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_c8);
    } while (1 < (ulong)(((long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                        -0x3333333333333333));
  }
  pSVar13 = local_80;
  dVar7 = ((local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
            super__Vector_impl_data._M_start)->bound).center.y;
  uVar5 = *(undefined8 *)
           &((local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
              super__Vector_impl_data._M_start)->bound).center.z;
  (local_80->bound).center.x =
       ((local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
         super__Vector_impl_data._M_start)->bound).center.x;
  (local_80->bound).center.y = dVar7;
  *(undefined8 *)&(local_80->bound).center.z = uVar5;
  std::vector<SphereTree,_std::allocator<SphereTree>_>::vector
            (&local_80->child,
             &(local_e8.super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
               super__Vector_impl_data._M_start)->child);
  std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector(&local_e8);
  return pSVar13;
}

Assistant:

SphereTree sphere_hierarchy(std::vector<Sphere> spheres)
{
	console.log("building sphere hierarchy...");
	// build leaf nodes
	std::vector<SphereTree> nodes;
	for (auto s: spheres)
		nodes.push_back(SphereTree(s));
	// successively form next layer
	while (nodes.size() > 1) {
		// randomly select representatives
		std::random_shuffle(nodes.begin(), nodes.end());
		std::vector<SphereTree> parents;
		for (int i=0; i<(nodes.size()-1)/4+1; ++i)
			parents.push_back(SphereTree(nodes[i].bound));
		// iteratively assign & optimize
		float lastloss = 1e18;
		while (true) {
			// stage 1. assign
			for (auto& p: parents)
				p.child.clear();
			for (auto o: nodes)
				argmin(parents, [o](const SphereTree& t){return norm(t.bound.center - o.bound.center);})->child.push_back(o);
			// state 2. optimize
			for (auto& p: parents)
				p.bound = sphere_set_bounding_sphere(sphere_tree_leaves(p));
			// calculate total loss
			float curloss = 0;
			for (auto p: parents)
				curloss += p.bound.radius;
			if (curloss > lastloss)
				console.debug("sphere clustering: loss increasing");
			if (curloss > lastloss - 1e-5)
				break;
			lastloss = curloss;
		}
		nodes = parents;
	}
	return nodes[0];
}